

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  uint uVar1;
  xmlStreamCompPtr pxVar2;
  xmlStreamStepPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  _xmlStreamCtxt *comp;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  uint local_70;
  
  uVar9 = 0xffffffff;
  if ((stream != (xmlStreamCtxtPtr)0x0) && (-1 < stream->nbState)) {
    iVar8 = 0;
    uVar9 = 0;
    do {
      uVar10 = 0;
      comp = stream;
      local_70 = uVar9;
      while (pxVar2 = comp->comp, ns != (xmlChar *)0x0 || (name != (xmlChar *)0x0 || nodeType != 1))
      {
        if (pxVar2->nbStep == 0) {
          if ((comp->flags & 1U) != 0) goto LAB_0016c2aa;
          if ((nodeType != 2) && (((comp->flags & 6U) == 0 || (comp->level == 0)))) {
            local_70 = 1;
          }
LAB_0016c58b:
          comp->level = comp->level + 1;
        }
        else {
          if ((comp->blockLevel != -1) ||
             ((nodeType - 3U < 0xfffffffe && ((pxVar2->flags & 0x4000) == 0)))) goto LAB_0016c58b;
          iVar7 = comp->nbState;
          if (0 < iVar7) {
            iVar13 = 0;
            do {
              if (((uint)pxVar2->flags >> 0x10 & 1) == 0) {
                if (comp->states[comp->nbState * 2 + -1] < comp->level) {
                  return -1;
                }
                iVar11 = comp->states[comp->nbState * 2 + -2];
                iVar13 = iVar7;
LAB_0016c33f:
                pxVar3 = pxVar2->steps;
                uVar1 = pxVar3[iVar11].flags;
                iVar6 = pxVar3[iVar11].nodeType;
                if (iVar6 == nodeType) {
                  if (iVar6 == 100) {
LAB_0016c47c:
                    bVar14 = false;
                  }
                  else {
                    pxVar4 = pxVar3[iVar11].name;
                    pxVar5 = pxVar3[iVar11].ns;
                    if (pxVar4 == (xmlChar *)0x0) {
                      bVar14 = pxVar5 != (xmlChar *)0x0;
                      if ((ns != (xmlChar *)0x0) && (pxVar5 != (xmlChar *)0x0)) {
                        iVar6 = xmlStrEqual(pxVar5,ns);
                        bVar14 = iVar6 == 0;
                      }
                    }
                    else {
                      bVar14 = true;
                      if ((((name != (xmlChar *)0x0) &&
                           ((ns == (xmlChar *)0x0) != (pxVar5 != (xmlChar *)0x0))) &&
                          (*pxVar4 == *name)) &&
                         ((iVar6 = xmlStrEqual(pxVar4,name), iVar6 != 0 &&
                          ((pxVar5 == ns || (iVar6 = xmlStrEqual(pxVar5,ns), iVar6 != 0))))))
                      goto LAB_0016c47c;
                    }
                  }
                  if (!bVar14) {
                    uVar10 = uVar1 & 2;
                    if (uVar10 == 0) {
                      xmlStreamCtxtAddState(comp,iVar11 + 1,comp->level + 1);
                      if (local_70 == 1) {
                        local_70 = 1;
                      }
                      else {
                        local_70 = uVar1 >> 5 & 1;
                      }
                    }
                    else {
                      local_70 = 1;
                    }
                  }
                  if ((pxVar2->flags & 0x10000) == 0) {
                    if ((bool)(bVar14 | uVar10 != 0)) goto LAB_0016c553;
                    uVar10 = 0;
                  }
                }
                else {
                  if (iVar6 == 100) goto LAB_0016c47c;
                  if ((iVar6 != 2) || (((uint)pxVar2->flags >> 0x10 & 1) != 0)) goto LAB_0016c567;
LAB_0016c553:
                  comp->blockLevel = comp->level + 1;
                }
              }
              else {
                iVar11 = comp->states[(uint)(iVar13 * 2)];
                if (-1 < (long)iVar11) {
                  iVar6 = comp->states[(ulong)(uint)(iVar13 * 2) + 1];
                  if ((iVar6 <= comp->level) &&
                     ((comp->level <= iVar6 || ((pxVar2->steps[iVar11].flags & 1U) != 0))))
                  goto LAB_0016c33f;
                }
              }
LAB_0016c567:
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar7);
          }
          iVar7 = comp->level;
          iVar13 = iVar7 + 1;
          comp->level = iVar13;
          pxVar3 = pxVar2->steps;
          uVar1 = pxVar3->flags;
          if ((uVar1 & 4) != 0) goto LAB_0016c2aa;
          pxVar4 = pxVar3->name;
          pxVar5 = pxVar3->ns;
          iVar11 = pxVar3->nodeType;
          uVar12 = comp->flags;
          if ((uVar12 & 7) == 0) {
LAB_0016c5e0:
            if ((iVar11 == nodeType) || (nodeType != 2 && iVar11 == 100)) {
              if (iVar11 == 100) {
LAB_0016c61b:
                bVar14 = false;
              }
              else if (pxVar4 == (xmlChar *)0x0) {
                bVar14 = pxVar5 != (xmlChar *)0x0;
                if ((ns != (xmlChar *)0x0) && (pxVar5 != (xmlChar *)0x0)) {
                  iVar7 = xmlStrEqual(pxVar5,ns);
                  bVar14 = iVar7 == 0;
                }
              }
              else {
                bVar14 = true;
                if ((((name != (xmlChar *)0x0) &&
                     ((ns == (xmlChar *)0x0) != (pxVar5 != (xmlChar *)0x0))) && (*pxVar4 == *name))
                   && ((iVar7 = xmlStrEqual(pxVar4,name), iVar7 != 0 &&
                       ((pxVar5 == ns || (iVar7 = xmlStrEqual(pxVar5,ns), iVar7 != 0))))))
                goto LAB_0016c61b;
              }
              uVar10 = uVar1 & 2;
              uVar12 = local_70;
              if (((!bVar14) && (uVar12 = 1, uVar10 == 0)) &&
                 (xmlStreamCtxtAddState(comp,1,comp->level), local_70 != 1)) {
                uVar12 = uVar1 >> 5 & 1;
              }
              local_70 = uVar12;
              if ((pxVar2->flags & 0x10000) == 0) {
                if ((bool)(uVar10 == 0 & (bVar14 ^ 1U))) {
                  uVar10 = 0;
                }
                else {
                  comp->blockLevel = comp->level;
                }
              }
            }
          }
          else if (iVar7 == 0) {
            if ((uVar12 & 6) == 0) goto LAB_0016c5e0;
          }
          else if (((uVar1 & 1) != 0) || ((uVar12 & 6) != 0 && iVar13 == 2)) goto LAB_0016c5e0;
        }
LAB_0016c2aa:
        comp = comp->next;
        if (comp == (_xmlStreamCtxt *)0x0) goto LAB_0016c81a;
      }
      stream->nbState = 0;
      stream->level = 0;
      stream->blockLevel = -1;
      if ((pxVar2->flags & 0x8000) != 0) {
        if ((pxVar2->nbStep == 0) ||
           (((pxVar2->nbStep == 1 && (pxVar2->steps->nodeType == 100)) &&
            ((pxVar2->steps->flags & 1) != 0)))) {
          uVar9 = 1;
        }
        else if ((pxVar2->steps->flags & 4) != 0) {
          iVar7 = xmlStreamCtxtAddState(stream,0,0);
          iVar8 = iVar8 - (iVar7 >> 0x1f);
        }
      }
      stream = stream->next;
      local_70 = uVar9;
    } while (stream != (_xmlStreamCtxt *)0x0);
LAB_0016c81a:
    uVar9 = 0xffffffff;
    if (iVar8 < 1) {
      uVar9 = local_70;
    }
  }
  return uVar9;
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, err = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;
#ifdef DEBUG_STREAMING
    xmlStreamCtxtPtr orig = stream;
#endif

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			/* TODO: Do we need this ? */
			tmp = xmlStreamCtxtAddState(stream, 0, 0);
			if (tmp < 0)
			    err++;
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
#if 0
/*
* TODO: Pointer comparison won't work, since not guaranteed that the given
*  values are in the same dict; especially if it's the namespace name,
*  normally coming from ns->href. We need a namespace dict mechanism !
*/
	    } else if (comp->dict) {
		if (step.name == NULL) {
		    if (step.ns == NULL)
			match = 1;
		    else
			match = (step.ns == ns);
		} else {
		    match = ((step.name == name) && (step.ns == ns));
		}
#endif /* if 0 ------------------------------------------------------- */
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
		if (desc) {
		    if (final) {
			ret = 1;
		    } else {
			/* descending match create a new state */
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		} else {
		    if (final) {
			ret = 1;
		    } else {
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		}
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final)
		ret = 1;
	    else
		xmlStreamCtxtAddState(stream, 1, stream->level);
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    if (err > 0)
        ret = -1;
#ifdef DEBUG_STREAMING
    xmlDebugStreamCtxt(orig, ret);
#endif
    return(ret);
}